

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O2

void __thiscall
InstructionInfo::expand
          (InstructionInfo *this,vector<InstructionInfo,_std::allocator<InstructionInfo>_> *out)

{
  uint uVar1;
  pointer pFVar2;
  Field *pFVar3;
  ostream *poVar4;
  pointer ppFVar5;
  uint uVar6;
  Field *f;
  pointer pFVar7;
  pointer ppFVar8;
  bool bVar9;
  vector<Field_*,_std::allocator<Field_*>_> expandedFields;
  string saveName;
  ostringstream nstr;
  _Vector_base<Field_*,_std::allocator<Field_*>_> local_208;
  vector<InstructionInfo,_std::allocator<InstructionInfo>_> *local_1f0;
  string local_1e8 [32];
  string local_1c8 [32];
  pointer local_1a8 [47];
  
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar2 = (this->fields).super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1f0 = out;
  for (pFVar7 = (this->fields).super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                super__Vector_impl_data._M_start; pFVar7 != pFVar2; pFVar7 = pFVar7 + 1) {
    if ((pFVar7->match == false) && (pFVar7->expand == true)) {
      pFVar7->match = true;
      pFVar7->value = 0;
      local_1a8[0] = pFVar7;
      std::vector<Field*,std::allocator<Field*>>::emplace_back<Field*>
                ((vector<Field*,std::allocator<Field*>> *)&local_208,local_1a8);
    }
  }
  std::__cxx11::string::string(local_1e8,(string *)this);
  do {
    uVar6 = 1;
    ppFVar5 = local_208._M_impl.super__Vector_impl_data._M_start;
    while ((ppFVar5 != local_208._M_impl.super__Vector_impl_data._M_finish && ((char)uVar6 != '\0'))
          ) {
      pFVar3 = *ppFVar5;
      uVar1 = pFVar3->value;
      uVar6 = uVar1 & 1;
      pFVar3->value = uVar6 ^ 1;
      bVar9 = true;
      if ((uVar1 & 1) == 0) {
        bVar9 = pFVar3->to - pFVar3->from == 1;
      }
      pFVar3->match = bVar9;
      ppFVar5 = ppFVar5 + 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar4 = std::operator<<((ostream *)local_1a8,local_1e8);
    ppFVar5 = local_208._M_impl.super__Vector_impl_data._M_finish;
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    for (ppFVar8 = local_208._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar5;
        ppFVar8 = ppFVar8 + 1) {
      poVar4 = std::operator<<((ostream *)local_1a8,"_");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)this,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::vector<InstructionInfo,_std::allocator<InstructionInfo>_>::push_back(local_1f0,this);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  } while (uVar6 == 0);
  std::__cxx11::string::_M_assign((string *)this);
  for (ppFVar5 = local_208._M_impl.super__Vector_impl_data._M_start;
      ppFVar5 != local_208._M_impl.super__Vector_impl_data._M_finish; ppFVar5 = ppFVar5 + 1) {
    pFVar3 = *ppFVar5;
    pFVar3->match = false;
    pFVar3->value = 0;
  }
  std::__cxx11::string::~string(local_1e8);
  std::_Vector_base<Field_*,_std::allocator<Field_*>_>::~_Vector_base(&local_208);
  return;
}

Assistant:

void InstructionInfo::expand(std::vector<InstructionInfo>& out)
{
    std::vector<Field*> expandedFields;
    for(Field& f : fields)
    {
        if(f.match || !f.expand)
            continue;
        f.match = true;
        f.value = 0;
        expandedFields.push_back(&f);
    }
    
    bool carry;
    std::string saveName = name;
    
    do
    {
        carry = true;

        for(Field *f : expandedFields)
        {
            if(!carry)
                break;
            
            //uint32_t mask = ((uint32_t)1U << (uint32_t)f->bitsize()) - 1U;
            f->value = (f->value + 1) & 1; //mask;
            carry = f->value == 0;

            if(f->value == 0 || f->bitsize() == 1)
            {
                f->match = true;
            }
            else
            {
                f->match = false;
            }
        }

        std::ostringstream nstr;
        nstr << saveName << std::hex;
        for(Field *f : expandedFields)
            nstr << "_" << f->value;
        name = nstr.str();
        out.push_back(*this);
    } while(!carry);
    
    name = saveName;
    
    for(Field *f : expandedFields)
    {
        f->match = false;
        f->value = 0;
    }
}